

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O0

int FeederBigRand1(void)

{
  uint uVar1;
  DWORD DVar2;
  int iVar3;
  DWORD DVar4;
  FILE *__stream;
  size_t sVar5;
  uint local_40;
  uint randomPrefixLength;
  uint i;
  DWORD t;
  char pattern [17];
  uint bigTestN;
  FILE *in;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    uVar1 = testN - 0x10;
    if (uVar1 < 2) {
      printf("Creating large text with seed %u... ",(ulong)(uint)seed[uVar1]);
      fflush(_stdout);
      i._0_1_ = '0';
      i._1_1_ = '1';
      i._2_1_ = '2';
      i._3_1_ = '3';
      t._0_1_ = '4';
      t._1_1_ = '5';
      t._2_1_ = '6';
      t._3_1_ = '7';
      builtin_strncpy(pattern,"89abcdef",9);
      srand(seed[uVar1]);
      DVar2 = GetTickCount();
      iVar3 = fputs((char *)&i,__stream);
      if ((iVar3 == -1) || (iVar3 = fputc(10,__stream), iVar3 == -1)) {
        printf("can\'t write in in.txt. No space on disk?\n");
        fclose(__stream);
        in._4_4_ = -1;
      }
      else {
        for (local_40 = 1; local_40 < 0x800000; local_40 = local_40 + 1) {
          uVar1 = rand();
          uVar1 = uVar1 % 0x11;
          if (uVar1 == 0) {
            iVar3 = putc(0x20,__stream);
            if (iVar3 == -1) {
              printf("can\'t write in in.txt. No space on disk?\n");
              fclose(__stream);
              return -1;
            }
          }
          else {
            sVar5 = fwrite(&i,1,(ulong)uVar1,__stream);
            if (sVar5 != uVar1) {
              printf("can\'t write in in.txt. No space on disk?\n");
              fclose(__stream);
              return -1;
            }
          }
        }
        iVar3 = fputs((char *)&i,__stream);
        if (iVar3 == -1) {
          printf("can\'t write in in.txt. No space on disk?\n");
          fclose(__stream);
          in._4_4_ = -1;
        }
        else {
          fclose(__stream);
          DVar4 = GetTickCount();
          uVar1 = RoundUptoThousand(DVar4 - DVar2);
          printf("done in T=%u seconds. Starting exe with timeout 6*T... ",(ulong)uVar1 / 1000,
                 (ulong)uVar1 % 1000);
          LabTimeout = uVar1 * 6;
          fflush(_stdout);
          in._4_4_ = 0;
        }
      }
    }
    else {
      printf("\nInternal error: incorrect test number\n");
      testN = testN + 1;
      fclose(__stream);
      in._4_4_ = -1;
    }
  }
  return in._4_4_;
}

Assistant:

static int FeederBigRand1(void) {
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    unsigned int bigTestN = testN - sizeof(testInOut) / sizeof(testInOut[0]);
    if (bigTestN >= sizeof(seed) / sizeof(seed[0])) {
        printf("\nInternal error: incorrect test number\n");
        ++testN;
        fclose(in);
        return -1;
    }
    printf("Creating large text with seed %u... ", seed[bigTestN]);
    fflush(stdout);
    const char pattern[] = "0123456789abcdef";
    srand(seed[bigTestN]);
    DWORD t = GetTickCount();
    if (fputs(pattern, in) == EOF || fputc('\n',in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    for (unsigned int i = 1; i < 1024 * 1024 * 8; ++i) {
        unsigned int randomPrefixLength = (unsigned int)rand() % 17;
        if (randomPrefixLength == 0) {
            if (putc(' ', in) == EOF) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        } else {
            if (fwrite(pattern, 1, randomPrefixLength, in) != randomPrefixLength) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }

    }
    if (fputs(pattern, in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 6*T... ", (unsigned)(t / 1000));
    LabTimeout = (int)t * 6;
    fflush(stdout);
    return 0;
}